

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCArray NULLCTypeInfo::TypeName(int *type)

{
  uint uVar1;
  NULLCArray NVar2;
  FastVector<ExternTypeInfo,_false,_false> *this;
  char *pcVar3;
  ExternTypeInfo *pEVar4;
  size_t sVar5;
  char *symbols;
  FastVector<ExternTypeInfo,_false,_false> *exTypes;
  int *type_local;
  NULLCArray ret;
  
  if (linker != 0) {
    this = (FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200);
    pcVar3 = FastVector<char,_false,_false>::operator[]
                       ((FastVector<char,_false,_false> *)(linker + 0x290),0);
    pEVar4 = FastVector<ExternTypeInfo,_false,_false>::operator[](this,*type);
    uVar1 = pEVar4->offsetToName;
    sVar5 = strlen(pcVar3 + uVar1);
    NVar2.len = (int)sVar5 + 1;
    NVar2.ptr = pcVar3 + uVar1;
    return NVar2;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0xbb,"NULLCArray NULLCTypeInfo::TypeName(int *)");
}

Assistant:

NULLCArray TypeName(int* type)
	{
		assert(linker);
		NULLCArray ret;
		FastVector<ExternTypeInfo> &exTypes = linker->exTypes;
		char *symbols = &linker->exSymbols[0];

		ret.ptr = exTypes[*type].offsetToName + symbols;
		ret.len = (unsigned int)strlen(ret.ptr) + 1;
		return ret;
	}